

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HL1MDLLoader.cpp
# Opt level: O0

void __thiscall
Assimp::MDL::HalfLife::HL1MDLLoader::validate_header
          (HL1MDLLoader *this,Header_HL1 *header,bool is_texture_header)

{
  int iVar1;
  DeadlyImportError *pDVar2;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  undefined1 local_11a;
  allocator<char> local_119;
  string local_118;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0;
  undefined1 local_ca;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  Header_HL1 *pHStack_18;
  bool is_texture_header_local;
  Header_HL1 *header_local;
  HL1MDLLoader *this_local;
  
  local_19 = is_texture_header;
  pHStack_18 = header;
  header_local = (Header_HL1 *)this;
  if (is_texture_header) {
    if (header->numtextures == 0) {
      local_55 = 1;
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"[Half-Life 1 MDL] There are no textures in the file",&local_41
                );
      DeadlyImportError::DeadlyImportError(pDVar2,&local_40);
      local_55 = 0;
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (100 < header->numtextures) {
      iVar1 = header->numtextures;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"textures",&local_79);
      log_warning_limit_exceeded<100>(iVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
    }
    if (100 < pHStack_18->numskinfamilies) {
      iVar1 = pHStack_18->numskinfamilies;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,"skin families",&local_a1);
      log_warning_limit_exceeded<100>(iVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator(&local_a1);
    }
  }
  else {
    if (header->numbodyparts == 0) {
      local_ca = 1;
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"[Half-Life 1 MDL] Model has no bodyparts",&local_c9);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_c8);
      local_ca = 0;
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (header->numbones == 0) {
      local_f2 = 1;
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f0,"[Half-Life 1 MDL] Model has no bones",&local_f1);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_f0);
      local_f2 = 0;
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (header->numseqgroups == 0) {
      local_11a = 1;
      pDVar2 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"[Half-Life 1 MDL] Model has no sequence groups",&local_119);
      DeadlyImportError::DeadlyImportError(pDVar2,&local_118);
      local_11a = 0;
      __cxa_throw(pDVar2,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    if (0x20 < header->numbodyparts) {
      iVar1 = header->numbodyparts;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_140,"bodyparts",&local_141);
      log_warning_limit_exceeded<32>(iVar1,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator(&local_141);
    }
    if (0x80 < pHStack_18->numbones) {
      iVar1 = pHStack_18->numbones;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"bones",&local_169);
      log_warning_limit_exceeded<128>(iVar1,&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::~allocator(&local_169);
    }
    if (8 < pHStack_18->numbonecontrollers) {
      iVar1 = pHStack_18->numbonecontrollers;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_190,"bone controllers",&local_191);
      log_warning_limit_exceeded<8>(iVar1,&local_190);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator(&local_191);
    }
    if (0x800 < pHStack_18->numseq) {
      iVar1 = pHStack_18->numseq;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b8,"sequences",&local_1b9);
      log_warning_limit_exceeded<2048>(iVar1,&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::allocator<char>::~allocator(&local_1b9);
    }
    if (0x20 < pHStack_18->numseqgroups) {
      iVar1 = pHStack_18->numseqgroups;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,"sequence groups",&local_1e1);
      log_warning_limit_exceeded<32>(iVar1,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
    }
    if (0x200 < pHStack_18->numattachments) {
      iVar1 = pHStack_18->numattachments;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_208,"attachments",&local_209);
      log_warning_limit_exceeded<512>(iVar1,&local_208);
      std::__cxx11::string::~string((string *)&local_208);
      std::allocator<char>::~allocator(&local_209);
    }
  }
  return;
}

Assistant:

void HL1MDLLoader::validate_header(const Header_HL1 *header, bool is_texture_header) {
    if (is_texture_header) {
        // Every single Half-Life model is assumed to have at least one texture.
        if (!header->numtextures)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "There are no textures in the file");

        if (header->numtextures > AI_MDL_HL1_MAX_TEXTURES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_TEXTURES>(header->numtextures, "textures");

        if (header->numskinfamilies > AI_MDL_HL1_MAX_SKIN_FAMILIES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SKIN_FAMILIES>(header->numskinfamilies, "skin families");

    } else {
        // Every single Half-Life model is assumed to have at least one bodypart.
        if (!header->numbodyparts)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bodyparts");

        // Every single Half-Life model is assumed to have at least one bone.
        if (!header->numbones)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no bones");

        // Every single Half-Life model is assumed to have at least one sequence group,
        // which is the "default" sequence group.
        if (!header->numseqgroups)
            throw DeadlyImportError(MDL_HALFLIFE_LOG_HEADER "Model has no sequence groups");

        if (header->numbodyparts > AI_MDL_HL1_MAX_BODYPARTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BODYPARTS>(header->numbodyparts, "bodyparts");

        if (header->numbones > AI_MDL_HL1_MAX_BONES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONES>(header->numbones, "bones");

        if (header->numbonecontrollers > AI_MDL_HL1_MAX_BONE_CONTROLLERS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_BONE_CONTROLLERS>(header->numbonecontrollers, "bone controllers");

        if (header->numseq > AI_MDL_HL1_MAX_SEQUENCES)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCES>(header->numseq, "sequences");

        if (header->numseqgroups > AI_MDL_HL1_MAX_SEQUENCE_GROUPS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_SEQUENCE_GROUPS>(header->numseqgroups, "sequence groups");

        if (header->numattachments > AI_MDL_HL1_MAX_ATTACHMENTS)
            log_warning_limit_exceeded<AI_MDL_HL1_MAX_ATTACHMENTS>(header->numattachments, "attachments");
    }
}